

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_compiler.c
# Opt level: O0

DatatypeMatch
compatible_arg_datatype
          (Context_conflict *ctx,MOJOSHADER_astDataType *arg,MOJOSHADER_astDataType *param)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  MOJOSHADER_astDataType *pMVar5;
  MOJOSHADER_astDataType *pMVar6;
  bool bVar7;
  int paramfloat;
  int argfloat;
  int paramsize;
  int argsize;
  int do_base_test;
  MOJOSHADER_astDataType *param_local;
  MOJOSHADER_astDataType *arg_local;
  Context_conflict *ctx_local;
  
  iVar1 = datatypes_match(arg,param);
  if (iVar1 == 0) {
    pMVar5 = reduce_datatype(ctx,arg);
    pMVar6 = reduce_datatype(ctx,param);
    bVar7 = false;
    iVar1 = is_scalar_datatype(pMVar5);
    if (iVar1 == 0) {
      if (pMVar5->type == pMVar6->type) {
        if (pMVar5->type == MOJOSHADER_AST_DATATYPE_VECTOR) {
          bVar7 = (pMVar5->array).elements == (pMVar6->array).elements;
        }
        else if ((pMVar5->type == MOJOSHADER_AST_DATATYPE_MATRIX) &&
                (bVar7 = false, (pMVar5->array).elements == (pMVar6->array).elements)) {
          bVar7 = (pMVar5->matrix).columns == (pMVar6->matrix).columns;
        }
      }
    }
    else {
      bVar7 = true;
    }
    if (bVar7) {
      pMVar5 = datatype_base(ctx,pMVar5);
      pMVar6 = datatype_base(ctx,pMVar6);
      iVar1 = datatype_size(pMVar5);
      iVar2 = datatype_size(pMVar6);
      iVar3 = is_float_datatype(pMVar5);
      iVar4 = is_float_datatype(pMVar6);
      if ((iVar3 == 0) || (iVar4 != 0)) {
        if ((iVar3 == 0) || (iVar4 != 0)) {
          if (iVar1 == iVar2) {
            ctx_local._4_4_ = DT_MATCH_COMPATIBLE;
          }
          else if (iVar1 < iVar2) {
            ctx_local._4_4_ = DT_MATCH_COMPATIBLE_UPCAST;
          }
          else {
            ctx_local._4_4_ = DT_MATCH_COMPATIBLE_DOWNCAST;
          }
        }
        else if (iVar1 < iVar2) {
          ctx_local._4_4_ = DT_MATCH_COMPATIBLE_UPCAST;
        }
        else {
          ctx_local._4_4_ = DT_MATCH_COMPATIBLE_DOWNCAST;
        }
      }
      else {
        ctx_local._4_4_ = DT_MATCH_COMPATIBLE_DOWNCAST;
      }
    }
    else {
      ctx_local._4_4_ = DT_MATCH_INCOMPATIBLE;
    }
  }
  else {
    ctx_local._4_4_ = DT_MATCH_PERFECT;
  }
  return ctx_local._4_4_;
}

Assistant:

static DatatypeMatch compatible_arg_datatype(Context *ctx,
                                   const MOJOSHADER_astDataType *arg,
                                   const MOJOSHADER_astDataType *param)
{
    // The matching rules for HLSL function overloading, as far as I can
    //  tell from experimenting with Microsoft's compiler, seem to be this:
    //
    // - All parameters of a function must match what the caller specified
    //   after possible type promotion via the following rules.
    // - If the number of arguments and the number of parameters don't match,
    //   that overload is immediately rejected.
    // - Each overloaded function is given a score that is the sum of the
    //   "worth" of each parameter vs the caller's arguments
    //   (see DatatypeMatch). The higher the score, the more favorable this
    //   function overload would be.
    // - If there is a tie for highest score between two or more function
    //   overloads, we declare that function call to be ambiguous and fail().
    // - Scalars can be promoted to vectors to make a parameter match.
    // - Scalars can promote to other scalars (short to int, etc).
    // - Datatypes can downcast, but should generate a warning.
    //   (calling void fn(float x); as fn((double)1.0) should warn).
    // - Vectors may NOT be extend (a float2 can't implicity extend to a
    //   float4).
    // - Vectors with the same elements can promote (a half2 can become
    //   a float2). Downcasting between vectors with the same number of
    //   elements is allowed.
    // - A perfect match of all params will be favored over any functions
    //   that only match if type promotion is applied (given a perfect match
    //   of all parameters, we'll stop looking for other matches).

    if (datatypes_match(arg, param))
        return DT_MATCH_PERFECT;  // that was easy.

    arg = reduce_datatype(ctx, arg);
    param = reduce_datatype(ctx, param);

    int do_base_test = 0;

    if (is_scalar_datatype(arg))
        do_base_test = 1; // we let these all go through for now.

    else if (arg->type == param->type)
    {
        if (arg->type == MOJOSHADER_AST_DATATYPE_VECTOR)
            do_base_test = (arg->vector.elements == param->vector.elements);
        else if (arg->type == MOJOSHADER_AST_DATATYPE_MATRIX)
        {
            do_base_test =
                ((arg->matrix.rows == param->matrix.rows) &&
                 (arg->matrix.columns == param->matrix.columns));
        } // if
    } // if

    if (do_base_test)
    {
        arg = datatype_base(ctx, arg);
        param = datatype_base(ctx, param);

        const int argsize = datatype_size(arg);
        const int paramsize = datatype_size(param);
        const int argfloat = is_float_datatype(arg);
        const int paramfloat = is_float_datatype(param);

        if (argfloat && !paramfloat)
            return DT_MATCH_COMPATIBLE_DOWNCAST;  // always loss of precision.
        else if (argfloat && !paramfloat)
        {
            if (argsize < paramsize)
                return DT_MATCH_COMPATIBLE_UPCAST;
            else
                return DT_MATCH_COMPATIBLE_DOWNCAST;  // loss of precision.
        } // else if
        else if (argsize == paramsize)
            return DT_MATCH_COMPATIBLE;
        else if (argsize < paramsize)
            return DT_MATCH_COMPATIBLE_UPCAST;
        else /* if (argsize > paramsize) */
            return DT_MATCH_COMPATIBLE_DOWNCAST;
    } // if

    return DT_MATCH_INCOMPATIBLE;
}